

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTsim.c
# Opt level: O2

void Gia_ManTerStatesFree(Vec_Ptr_t *vStates)

{
  void *__ptr;
  int i;
  int i_00;
  
  for (i_00 = 0; i_00 < vStates->nSize; i_00 = i_00 + 1) {
    __ptr = Vec_PtrEntry(vStates,i_00);
    free(__ptr);
  }
  free(vStates->pArray);
  free(vStates);
  return;
}

Assistant:

void Gia_ManTerStatesFree( Vec_Ptr_t * vStates )
{
    unsigned * pTemp;
    int i;
    Vec_PtrForEachEntry( unsigned *, vStates, pTemp, i )
        ABC_FREE( pTemp );
    Vec_PtrFree( vStates );
}